

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextodfwriter.cpp
# Opt level: O1

void __thiscall
QTextOdfWriter::writeBlockFormat
          (QTextOdfWriter *this,QXmlStreamWriter *writer,QTextBlockFormat format,int formatIndex)

{
  int *piVar1;
  Data *pDVar2;
  qsizetype qVar3;
  char16_t *pcVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  iterator iVar8;
  iterator iVar9;
  QDebug *pQVar10;
  QSharedDataPointer<QTextFormatPrivate> this_00;
  ulong uVar11;
  storage_type *psVar12;
  size_t sVar13;
  QArrayData *pQVar14;
  size_t sVar15;
  ulong uVar16;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar17;
  char16_t *pcVar18;
  QChar *pQVar19;
  Tab *pTVar20;
  long in_FS_OFFSET;
  qreal qVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  QByteArrayView QVar26;
  QAnyStringView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QAnyStringView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QAnyStringView QVar33;
  QByteArrayView QVar34;
  QAnyStringView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QAnyStringView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QAnyStringView QVar44;
  QByteArrayView QVar45;
  QAnyStringView QVar46;
  QByteArrayView QVar47;
  QAnyStringView QVar48;
  QByteArrayView QVar49;
  QAnyStringView QVar50;
  QByteArrayView QVar51;
  QAnyStringView QVar52;
  QByteArrayView QVar53;
  QAnyStringView QVar54;
  QByteArrayView QVar55;
  QByteArrayView QVar56;
  QAnyStringView QVar57;
  QByteArrayView QVar58;
  QByteArrayView QVar59;
  QAnyStringView QVar60;
  QByteArrayView QVar61;
  QAnyStringView QVar62;
  QByteArrayView QVar63;
  QByteArrayView QVar64;
  QAnyStringView QVar65;
  QByteArrayView QVar66;
  QAnyStringView QVar67;
  QByteArrayView QVar68;
  QAnyStringView QVar69;
  QByteArrayView QVar70;
  QAnyStringView QVar71;
  QByteArrayView QVar72;
  QByteArrayView QVar73;
  QAnyStringView QVar74;
  QByteArrayView QVar75;
  QAnyStringView QVar76;
  QAnyStringView QVar77;
  QAnyStringView QVar78;
  QAnyStringView QVar79;
  QAnyStringView QVar80;
  QAnyStringView QVar81;
  QAnyStringView QVar82;
  QAnyStringView QVar83;
  QAnyStringView QVar84;
  QAnyStringView QVar85;
  QAnyStringView QVar86;
  QAnyStringView QVar87;
  QAnyStringView QVar88;
  QAnyStringView QVar89;
  QAnyStringView QVar90;
  QAnyStringView QVar91;
  QAnyStringView QVar92;
  QAnyStringView QVar93;
  QAnyStringView QVar94;
  QAnyStringView QVar95;
  QAnyStringView QVar96;
  QAnyStringView QVar97;
  QAnyStringView QVar98;
  QAnyStringView QVar99;
  QAnyStringView QVar100;
  QAnyStringView QVar101;
  QAnyStringView QVar102;
  QAnyStringView QVar103;
  QAnyStringView QVar104;
  QAnyStringView QVar105;
  QAnyStringView QVar106;
  QAnyStringView QVar107;
  QAnyStringView QVar108;
  QAnyStringView QVar109;
  QAnyStringView QVar110;
  QAnyStringView QVar111;
  QAnyStringView QVar112;
  QBrush brush;
  QArrayData *local_1f0;
  QArrayData *local_1e8;
  QDebug local_f8;
  QDebug local_f0;
  char16_t *local_e8;
  ulong uStack_e0;
  QArrayData *local_d8;
  char16_t *pcStack_d0;
  qsizetype local_c8;
  QStringBuilder<QString,_QString> local_b8;
  char16_t *local_88;
  ulong uStack_80;
  QString local_78;
  QString local_60;
  char16_t *local_48;
  ulong uStack_40;
  long local_38;
  
  this_00 = format.super_QTextFormat.d.d.ptr;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar18 = (this->styleNS).d.ptr;
  uVar11 = (this->styleNS).d.size;
  QVar26.m_data = &DAT_00000005;
  QVar26.m_size = (qsizetype)&local_b8;
  QString::fromLatin1(QVar26);
  QVar77.m_size._4_4_ = local_b8.a.d.ptr._4_4_;
  QVar77.m_size._0_4_ = local_b8.a.d.ptr._0_4_;
  QVar27.m_size = (size_t)pcVar18;
  QVar27.field_0.m_data_utf8 = (char *)writer;
  QVar77.field_0.m_data = (void *)(uVar11 | 0x8000000000000000);
  QXmlStreamWriter::writeStartElement(QVar27,QVar77);
  piVar1 = (int *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate
                ((QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_),2,0x10);
    }
  }
  pcVar18 = (this->styleNS).d.ptr;
  uVar11 = (this->styleNS).d.size;
  QVar28.m_data = (storage_type *)0x4;
  QVar28.m_size = (qsizetype)&local_b8;
  QString::fromLatin1(QVar28);
  QVar78.m_size._4_4_ = local_b8.a.d.ptr._4_4_;
  QVar78.m_size._0_4_ = local_b8.a.d.ptr._0_4_;
  uVar16 = CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size);
  QVar29.m_data = (storage_type *)0x3;
  QVar29.m_size = (qsizetype)&local_78;
  QString::fromLatin1(QVar29);
  sVar13 = 0x20;
  QString::arg_impl((longlong)&local_60,(int)&local_78,format.super_QTextFormat.format_type,
                    (QChar)0x0);
  local_48 = local_60.d.ptr;
  uStack_40 = local_60.d.size | 0x8000000000000000;
  QVar30.m_size = (size_t)pcVar18;
  QVar30.field_0.m_data_utf8 = (char *)writer;
  QVar78.field_0.m_data = (void *)(uVar11 | 0x8000000000000000);
  QVar97.m_size = sVar13;
  QVar97.field_0.m_data = (void *)(uVar16 | 0x8000000000000000);
  QXmlStreamWriter::writeAttribute(QVar30,QVar78,QVar97);
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QTextFormatPrivate *)local_78.d.d != (QTextFormatPrivate *)0x0) {
    LOCK();
    *(int *)local_78.d.d = *(int *)local_78.d.d + -1;
    UNLOCK();
    if (*(int *)local_78.d.d == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  piVar1 = (int *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate
                ((QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_),2,0x10);
    }
  }
  pcVar18 = (this->styleNS).d.ptr;
  uVar11 = (this->styleNS).d.size;
  QVar31.m_data = &DAT_00000006;
  QVar31.m_size = (qsizetype)&local_b8;
  QString::fromLatin1(QVar31);
  QVar79.m_size._4_4_ = local_b8.a.d.ptr._4_4_;
  QVar79.m_size._0_4_ = local_b8.a.d.ptr._0_4_;
  uVar16 = CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size);
  QVar32.m_data = (storage_type *)0x9;
  QVar32.m_size = (qsizetype)&local_60;
  QString::fromLatin1(QVar32);
  local_88 = local_60.d.ptr;
  uStack_80 = local_60.d.size | 0x8000000000000000;
  QVar33.m_size = (size_t)pcVar18;
  QVar33.field_0.m_data_utf8 = (char *)writer;
  QVar79.field_0.m_data = (void *)(uVar11 | 0x8000000000000000);
  QVar98.m_size = sVar13;
  QVar98.field_0.m_data = (void *)(uVar16 | 0x8000000000000000);
  QXmlStreamWriter::writeAttribute(QVar33,QVar79,QVar98);
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
    }
  }
  piVar1 = (int *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate
                ((QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_),2,0x10);
    }
  }
  pcVar18 = (this->styleNS).d.ptr;
  uVar11 = (this->styleNS).d.size;
  QVar34.m_data = (storage_type *)0x14;
  QVar34.m_size = (qsizetype)&local_b8;
  QString::fromLatin1(QVar34);
  QVar80.m_size._4_4_ = local_b8.a.d.ptr._4_4_;
  QVar80.m_size._0_4_ = local_b8.a.d.ptr._0_4_;
  QVar35.m_size = (size_t)pcVar18;
  QVar35.field_0.m_data_utf8 = (char *)writer;
  QVar80.field_0.m_data = (void *)(uVar11 | 0x8000000000000000);
  QXmlStreamWriter::writeStartElement(QVar35,QVar80);
  piVar1 = (int *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate
                ((QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_),2,0x10);
    }
  }
  bVar5 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x1049);
  if (!bVar5) goto LAB_005c608c;
  iVar6 = QTextFormat::intProperty((QTextFormat *)this_00.d.ptr,0x1049);
  qVar21 = QTextFormat::doubleProperty((QTextFormat *)this_00.d.ptr,0x1048);
  switch(iVar6) {
  case 0:
    QVar36.m_data = (storage_type *)0xb;
    QVar36.m_size = (qsizetype)&local_b8;
    QString::fromLatin1(QVar36);
    local_1e8 = (QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
    sVar15 = CONCAT44(local_b8.a.d.ptr._4_4_,local_b8.a.d.ptr._0_4_);
    uVar11 = CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size);
    QVar37.m_data = (storage_type *)0x4;
    QVar37.m_size = (qsizetype)&local_b8;
    QString::fromLatin1(QVar37);
    goto LAB_005c5fe5;
  case 1:
    QVar40.m_data = (storage_type *)0xb;
    QVar40.m_size = (qsizetype)&local_b8;
    QString::fromLatin1(QVar40);
    local_1e8 = (QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
    sVar15 = CONCAT44(local_b8.a.d.ptr._4_4_,local_b8.a.d.ptr._0_4_);
    uVar11 = CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size);
    QString::number(qVar21,(char)&local_78,0x67);
    QVar41.m_data = (storage_type *)0x1;
    QVar41.m_size = (qsizetype)&local_d8;
    QString::fromLatin1(QVar41);
    qVar3 = local_78.d.size;
    pcVar18 = local_78.d.ptr;
    pDVar2 = local_78.d.d;
    local_b8.b.d.size = local_c8;
    local_b8.b.d.ptr = pcStack_d0;
    local_b8.b.d.d = (Data *)local_d8;
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = (char16_t *)0x0;
    local_b8.a.d.d._0_4_ = SUB84(pDVar2,0);
    local_b8.a.d.d._4_4_ = (undefined4)((ulong)pDVar2 >> 0x20);
    local_b8.a.d.ptr._0_4_ = SUB84(pcVar18,0);
    local_b8.a.d.ptr._4_4_ = (undefined4)((ulong)pcVar18 >> 0x20);
    local_78.d.size = 0;
    local_b8.a.d.size._0_4_ = (undefined4)qVar3;
    local_b8.a.d.size._4_4_ = (undefined4)((ulong)qVar3 >> 0x20);
    local_d8 = (QArrayData *)0x0;
    pcStack_d0 = (char16_t *)0x0;
    local_c8 = 0;
    QStringBuilder<QString,_QString>::convertTo<QString>(&local_60,&local_b8);
    uVar16 = local_60.d.size;
    pcVar18 = local_60.d.ptr;
    pQVar14 = &(local_60.d.d)->super_QArrayData;
    local_60.d.d = (Data *)0x0;
    local_60.d.ptr = (char16_t *)0x0;
    local_60.d.size = 0;
    QStringBuilder<QString,_QString>::~QStringBuilder(&local_b8);
    if (local_d8 != (QArrayData *)0x0) {
      LOCK();
      (local_d8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_d8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_d8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_d8,2,0x10);
      }
    }
    if ((QTextFormatPrivate *)local_78.d.d != (QTextFormatPrivate *)0x0) {
      LOCK();
      *(int *)local_78.d.d = *(int *)local_78.d.d + -1;
      UNLOCK();
      if (*(int *)local_78.d.d == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    goto LAB_005c5ff0;
  case 2:
    psVar12 = (storage_type *)0xb;
    break;
  case 3:
    psVar12 = (storage_type *)0x14;
    break;
  case 4:
    psVar12 = (storage_type *)0xc;
    break;
  default:
    uVar16 = 0;
    pcVar18 = (char16_t *)0x0;
    pQVar14 = (QArrayData *)0x0;
    uVar11 = 0;
    sVar15 = 0;
    local_1e8 = (QArrayData *)0x0;
    goto LAB_005c5ff0;
  }
  QVar38.m_data = psVar12;
  QVar38.m_size = (qsizetype)&local_b8;
  QString::fromLatin1(QVar38);
  local_1e8 = (QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
  sVar15 = CONCAT44(local_b8.a.d.ptr._4_4_,local_b8.a.d.ptr._0_4_);
  uVar11 = CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size);
  if (qVar21 <= 0.0) {
    qVar21 = 0.0;
  }
  pixelToPoint(&local_b8.a,qVar21);
LAB_005c5fe5:
  pQVar14 = (QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
  pcVar18 = (char16_t *)CONCAT44(local_b8.a.d.ptr._4_4_,local_b8.a.d.ptr._0_4_);
  uVar16 = CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size);
LAB_005c5ff0:
  if (sVar15 != 0) {
    QVar81.field_0.m_data = (void *)((this->styleNS).d.size | 0x8000000000000000);
    uStack_e0 = uVar16 | 0x8000000000000000;
    QVar39.m_size = (size_t)(this->styleNS).d.ptr;
    QVar39.field_0.m_data_utf8 = (char *)writer;
    QVar81.m_size = sVar15;
    QVar99.m_size = sVar13;
    QVar99.field_0.m_data = (void *)(uVar11 | 0x8000000000000000);
    local_e8 = pcVar18;
    QXmlStreamWriter::writeAttribute(QVar39,QVar81,QVar99);
  }
  if (pQVar14 != (QArrayData *)0x0) {
    LOCK();
    (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar14->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar14,2,0x10);
    }
  }
  if (local_1e8 != (QArrayData *)0x0) {
    LOCK();
    (local_1e8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_1e8,2,0x10);
    }
  }
LAB_005c608c:
  bVar5 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x1010);
  if (!bVar5) goto LAB_005c63ac;
  iVar6 = QTextFormat::intProperty((QTextFormat *)this_00.d.ptr,0x1010);
  uVar7 = iVar6 + (uint)(iVar6 == 0) & 0x1f;
  switch(uVar7) {
  case 1:
LAB_005c60f2:
    psVar12 = &DAT_00000005;
    break;
  case 2:
    psVar12 = (storage_type *)0x3;
    break;
  case 3:
  case 5:
  case 6:
  case 7:
switchD_005c60cd_caseD_3:
    local_b8.a.d.d._0_4_ = 2;
    local_b8.a.d.d._4_4_ = 0;
    local_b8.a.d.ptr._0_4_ = 0;
    local_b8.a.d.ptr._4_4_ = 0;
    local_b8.a.d.size._0_4_ = 0;
    local_b8.a.d.size._4_4_ = 0;
    local_b8.b.d.d = (Data *)0x6b110e;
    QMessageLogger::warning();
    pQVar10 = QDebug::operator<<((QDebug *)&local_60,
                                 "QTextOdfWriter: unsupported paragraph alignment; ");
    local_f8.stream = pQVar10->stream;
    (local_f8.stream)->ref = (local_f8.stream)->ref + 1;
    iVar6 = QTextFormat::intProperty((QTextFormat *)this_00.d.ptr,0x1010);
    qt_QMetaEnum_flagDebugOperator
              ((QDebug *)&local_f0,(ulonglong)&local_f8,
               (QMetaObject *)(ulong)(iVar6 + (uint)(iVar6 == 0)),(char *)&Qt::staticMetaObject);
    QDebug::~QDebug(&local_f0);
    QDebug::~QDebug(&local_f8);
    QDebug::~QDebug((QDebug *)&local_60);
    uVar22 = 0;
    uVar23 = 0;
    uVar24 = 0;
    uVar25 = 0;
    goto LAB_005c62cd;
  case 4:
    psVar12 = &DAT_00000006;
    break;
  case 8:
    psVar12 = (storage_type *)0x7;
    break;
  default:
    if (uVar7 != 0x11) {
      if (uVar7 != 0x12) goto switchD_005c60cd_caseD_3;
      goto LAB_005c60f2;
    }
    psVar12 = (storage_type *)0x4;
  }
  QVar42.m_data = psVar12;
  QVar42.m_size = (qsizetype)&local_b8;
  QString::fromLatin1(QVar42);
  uVar22 = local_b8.a.d.d._0_4_;
  uVar23 = local_b8.a.d.d._4_4_;
  uVar24 = local_b8.a.d.ptr._0_4_;
  uVar25 = local_b8.a.d.ptr._4_4_;
LAB_005c62cd:
  if (CONCAT44(uVar25,uVar24) != 0) {
    pcVar18 = (this->foNS).d.ptr;
    uVar11 = (this->foNS).d.size;
    QVar43.m_data = (storage_type *)0xa;
    QVar43.m_size = (qsizetype)&local_b8;
    QString::fromLatin1(QVar43);
    QVar82.m_size._4_4_ = local_b8.a.d.ptr._4_4_;
    QVar82.m_size._0_4_ = local_b8.a.d.ptr._0_4_;
    QVar100.field_0.m_data =
         (void *)(CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size) |
                 0x8000000000000000);
    QVar44.m_size = (size_t)pcVar18;
    QVar44.field_0.m_data_utf8 = (char *)writer;
    QVar82.field_0.m_data = (void *)(uVar11 | 0x8000000000000000);
    QVar100.m_size = sVar13;
    QXmlStreamWriter::writeAttribute(QVar44,QVar82,QVar100);
    piVar1 = (int *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_),2,0x10);
      }
    }
  }
  pQVar14 = (QArrayData *)CONCAT44(uVar23,uVar22);
  if (pQVar14 != (QArrayData *)0x0) {
    LOCK();
    (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar14->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar14->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar14,2,0x10);
    }
  }
LAB_005c63ac:
  bVar5 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x1030);
  if (bVar5) {
    pcVar18 = (this->foNS).d.ptr;
    uVar11 = (this->foNS).d.size;
    QVar45.m_data = (storage_type *)0xa;
    QVar45.m_size = (qsizetype)&local_b8;
    QString::fromLatin1(QVar45);
    QVar83.m_size._4_4_ = local_b8.a.d.ptr._4_4_;
    QVar83.m_size._0_4_ = local_b8.a.d.ptr._0_4_;
    uVar16 = CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size);
    qVar21 = QTextFormat::doubleProperty((QTextFormat *)this_00.d.ptr,0x1030);
    if (qVar21 <= 0.0) {
      qVar21 = 0.0;
    }
    pixelToPoint(&local_60,qVar21);
    QVar46.m_size = (size_t)pcVar18;
    QVar46.field_0.m_data_utf8 = (char *)writer;
    QVar83.field_0.m_data = (void *)(uVar11 | 0x8000000000000000);
    QVar101.m_size = sVar13;
    QVar101.field_0.m_data = (void *)(uVar16 | 0x8000000000000000);
    QXmlStreamWriter::writeAttribute(QVar46,QVar83,QVar101);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    piVar1 = (int *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_),2,0x10);
      }
    }
  }
  bVar5 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x1031);
  if (bVar5) {
    pcVar18 = (this->foNS).d.ptr;
    uVar11 = (this->foNS).d.size;
    QVar47.m_data = (storage_type *)0xd;
    QVar47.m_size = (qsizetype)&local_b8;
    QString::fromLatin1(QVar47);
    QVar84.m_size._4_4_ = local_b8.a.d.ptr._4_4_;
    QVar84.m_size._0_4_ = local_b8.a.d.ptr._0_4_;
    uVar16 = CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size);
    qVar21 = QTextFormat::doubleProperty((QTextFormat *)this_00.d.ptr,0x1031);
    if (qVar21 <= 0.0) {
      qVar21 = 0.0;
    }
    pixelToPoint(&local_60,qVar21);
    QVar48.m_size = (size_t)pcVar18;
    QVar48.field_0.m_data_utf8 = (char *)writer;
    QVar84.field_0.m_data = (void *)(uVar11 | 0x8000000000000000);
    QVar102.m_size = sVar13;
    QVar102.field_0.m_data = (void *)(uVar16 | 0x8000000000000000);
    QXmlStreamWriter::writeAttribute(QVar48,QVar84,QVar102);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    piVar1 = (int *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_),2,0x10);
      }
    }
  }
  bVar5 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x1032);
  if ((bVar5) || (bVar5 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x1040), bVar5)) {
    pcVar18 = (this->foNS).d.ptr;
    uVar11 = (this->foNS).d.size;
    QVar49.m_data = (storage_type *)0xb;
    QVar49.m_size = (qsizetype)&local_b8;
    QString::fromLatin1(QVar49);
    QVar85.m_size._4_4_ = local_b8.a.d.ptr._4_4_;
    QVar85.m_size._0_4_ = local_b8.a.d.ptr._0_4_;
    uVar16 = CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size);
    qVar21 = QTextFormat::doubleProperty((QTextFormat *)this_00.d.ptr,0x1032);
    iVar6 = QTextFormat::intProperty((QTextFormat *)this_00.d.ptr,0x1040);
    qVar21 = (double)iVar6 + qVar21;
    if (qVar21 <= 0.0) {
      qVar21 = 0.0;
    }
    pixelToPoint(&local_60,qVar21);
    QVar50.m_size = (size_t)pcVar18;
    QVar50.field_0.m_data_utf8 = (char *)writer;
    QVar85.field_0.m_data = (void *)(uVar11 | 0x8000000000000000);
    QVar103.m_size = sVar13;
    QVar103.field_0.m_data = (void *)(uVar16 | 0x8000000000000000);
    QXmlStreamWriter::writeAttribute(QVar50,QVar85,QVar103);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    piVar1 = (int *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_),2,0x10);
      }
    }
  }
  bVar5 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x1033);
  if (bVar5) {
    pcVar18 = (this->foNS).d.ptr;
    uVar11 = (this->foNS).d.size;
    QVar51.m_data = (storage_type *)0xc;
    QVar51.m_size = (qsizetype)&local_b8;
    QString::fromLatin1(QVar51);
    QVar86.m_size._4_4_ = local_b8.a.d.ptr._4_4_;
    QVar86.m_size._0_4_ = local_b8.a.d.ptr._0_4_;
    uVar16 = CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size);
    qVar21 = QTextFormat::doubleProperty((QTextFormat *)this_00.d.ptr,0x1033);
    if (qVar21 <= 0.0) {
      qVar21 = 0.0;
    }
    pixelToPoint(&local_60,qVar21);
    QVar52.m_size = (size_t)pcVar18;
    QVar52.field_0.m_data_utf8 = (char *)writer;
    QVar86.field_0.m_data = (void *)(uVar11 | 0x8000000000000000);
    QVar104.m_size = sVar13;
    QVar104.field_0.m_data = (void *)(uVar16 | 0x8000000000000000);
    QXmlStreamWriter::writeAttribute(QVar52,QVar86,QVar104);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    piVar1 = (int *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_),2,0x10);
      }
    }
  }
  bVar5 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x1034);
  if (bVar5) {
    pcVar18 = (this->foNS).d.ptr;
    uVar11 = (this->foNS).d.size;
    QVar53.m_data = (storage_type *)0xb;
    QVar53.m_size = (qsizetype)&local_b8;
    QString::fromLatin1(QVar53);
    QVar87.m_size._4_4_ = local_b8.a.d.ptr._4_4_;
    QVar87.m_size._0_4_ = local_b8.a.d.ptr._0_4_;
    uVar16 = CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size);
    qVar21 = QTextFormat::doubleProperty((QTextFormat *)this_00.d.ptr,0x1034);
    pixelToPoint(&local_60,qVar21);
    QVar54.m_size = (size_t)pcVar18;
    QVar54.field_0.m_data_utf8 = (char *)writer;
    QVar87.field_0.m_data = (void *)(uVar11 | 0x8000000000000000);
    QVar105.m_size = sVar13;
    QVar105.field_0.m_data = (void *)(uVar16 | 0x8000000000000000);
    QXmlStreamWriter::writeAttribute(QVar54,QVar87,QVar105);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    piVar1 = (int *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_),2,0x10);
      }
    }
  }
  bVar5 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x7000);
  if (bVar5) {
    uVar7 = QTextFormat::intProperty((QTextFormat *)this_00.d.ptr,0x7000);
    if ((uVar7 & 1) != 0) {
      pcVar18 = (this->foNS).d.ptr;
      uVar11 = (this->foNS).d.size;
      QVar55.m_data = (storage_type *)0xc;
      QVar55.m_size = (qsizetype)&local_b8;
      QString::fromLatin1(QVar55);
      QVar88.m_size._4_4_ = local_b8.a.d.ptr._4_4_;
      QVar88.m_size._0_4_ = local_b8.a.d.ptr._0_4_;
      uVar16 = CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size);
      QVar56.m_data = (storage_type *)0x4;
      QVar56.m_size = (qsizetype)&local_60;
      QString::fromLatin1(QVar56);
      QVar57.m_size = (size_t)pcVar18;
      QVar57.field_0.m_data_utf8 = (char *)writer;
      QVar88.field_0.m_data = (void *)(uVar11 | 0x8000000000000000);
      QVar106.m_size = sVar13;
      QVar106.field_0.m_data = (void *)(uVar16 | 0x8000000000000000);
      QXmlStreamWriter::writeAttribute(QVar57,QVar88,QVar106);
      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
        }
      }
      piVar1 = (int *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_),2,0x10);
        }
      }
    }
    uVar7 = QTextFormat::intProperty((QTextFormat *)this_00.d.ptr,0x7000);
    if ((uVar7 & 0x10) != 0) {
      pcVar18 = (this->foNS).d.ptr;
      uVar11 = (this->foNS).d.size;
      QVar58.m_data = (storage_type *)0xb;
      QVar58.m_size = (qsizetype)&local_b8;
      QString::fromLatin1(QVar58);
      QVar89.m_size._4_4_ = local_b8.a.d.ptr._4_4_;
      QVar89.m_size._0_4_ = local_b8.a.d.ptr._0_4_;
      uVar16 = CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size);
      QVar59.m_data = (storage_type *)0x4;
      QVar59.m_size = (qsizetype)&local_60;
      QString::fromLatin1(QVar59);
      QVar60.m_size = (size_t)pcVar18;
      QVar60.field_0.m_data_utf8 = (char *)writer;
      QVar89.field_0.m_data = (void *)(uVar11 | 0x8000000000000000);
      QVar107.m_size = sVar13;
      QVar107.field_0.m_data = (void *)(uVar16 | 0x8000000000000000);
      QXmlStreamWriter::writeAttribute(QVar60,QVar89,QVar107);
      if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
        }
      }
      piVar1 = (int *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_),2,0x10);
        }
      }
    }
  }
  bVar5 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x820);
  if (bVar5) {
    local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QTextFormat::brushProperty((QTextFormat *)&local_78,(int)format.super_QTextFormat.d.d.ptr);
    pcVar18 = (this->foNS).d.ptr;
    uVar11 = (this->foNS).d.size;
    QVar61.m_data = (storage_type *)0x10;
    QVar61.m_size = (qsizetype)&local_b8;
    QString::fromLatin1(QVar61);
    QVar90.m_size._4_4_ = local_b8.a.d.ptr._4_4_;
    QVar90.m_size._0_4_ = local_b8.a.d.ptr._0_4_;
    uVar16 = CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size);
    QColor::name(&local_60,(QColor *)((long)local_78.d.d + 8),HexRgb);
    QVar62.m_size = (size_t)pcVar18;
    QVar62.field_0.m_data_utf8 = (char *)writer;
    QVar90.field_0.m_data = (void *)(uVar11 | 0x8000000000000000);
    QVar108.m_size = sVar13;
    QVar108.field_0.m_data = (void *)(uVar16 | 0x8000000000000000);
    QXmlStreamWriter::writeAttribute(QVar62,QVar90,QVar108);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    piVar1 = (int *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_),2,0x10);
      }
    }
    QBrush::~QBrush((QBrush *)&local_78);
  }
  bVar5 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x1050);
  if (bVar5) {
    pcVar18 = (this->foNS).d.ptr;
    uVar11 = (this->foNS).d.size;
    QVar63.m_data = (storage_type *)0xd;
    QVar63.m_size = (qsizetype)&local_b8;
    QString::fromLatin1(QVar63);
    QVar91.m_size._4_4_ = local_b8.a.d.ptr._4_4_;
    QVar91.m_size._0_4_ = local_b8.a.d.ptr._0_4_;
    uVar16 = CONCAT44(local_b8.a.d.size._4_4_,(undefined4)local_b8.a.d.size);
    bVar5 = QTextFormat::boolProperty((QTextFormat *)this_00.d.ptr,0x1050);
    if (bVar5) {
      psVar12 = (storage_type *)0x4;
    }
    else {
      psVar12 = &DAT_00000005;
    }
    QVar64.m_size = &local_60;
    QVar64.m_data = psVar12;
    QString::fromLatin1(QVar64);
    QVar65.m_size = (size_t)pcVar18;
    QVar65.field_0.m_data_utf8 = (char *)writer;
    QVar91.field_0.m_data = (void *)(uVar11 | 0x8000000000000000);
    QVar109.m_size = sVar13;
    QVar109.field_0.m_data = (void *)(uVar16 | 0x8000000000000000);
    QXmlStreamWriter::writeAttribute(QVar65,QVar91,QVar109);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    piVar1 = (int *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_),2,0x10);
      }
    }
  }
  bVar5 = QTextFormat::hasProperty((QTextFormat *)this_00.d.ptr,0x1035);
  if (bVar5) {
    local_b8.a.d.size._0_4_ = 0xaaaaaaaa;
    local_b8.a.d.size._4_4_ = 0xaaaaaaaa;
    local_b8.a.d.d._0_4_ = 0xaaaaaaaa;
    local_b8.a.d.d._4_4_ = 0xaaaaaaaa;
    local_b8.a.d.ptr._0_4_ = 0xaaaaaaaa;
    local_b8.a.d.ptr._4_4_ = 0xaaaaaaaa;
    QTextBlockFormat::tabPositions
              ((QList<QTextOption::Tab> *)&local_b8,(QTextBlockFormat *)this_00.d.ptr);
    pcVar18 = (this->styleNS).d.ptr;
    uVar11 = (this->styleNS).d.size;
    QVar66.m_data = (storage_type *)0x9;
    QVar66.m_size = (qsizetype)&local_60;
    QString::fromLatin1(QVar66);
    QVar67.m_size = (size_t)pcVar18;
    QVar67.field_0.m_data_utf8 = (char *)writer;
    QVar92.m_size = (size_t)local_60.d.ptr;
    QVar92.field_0.m_data = (void *)(uVar11 | 0x8000000000000000);
    QXmlStreamWriter::writeStartElement(QVar67,QVar92);
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
    iVar8 = QList<QTextOption::Tab>::begin((QList<QTextOption::Tab> *)&local_b8);
    iVar9 = QList<QTextOption::Tab>::end((QList<QTextOption::Tab> *)&local_b8);
    if (iVar8.i != iVar9.i) {
      pQVar19 = &(iVar8.i)->delimiter;
      do {
        pcVar18 = (this->styleNS).d.ptr;
        uVar11 = (this->styleNS).d.size;
        QVar68.m_data = (storage_type *)0x8;
        QVar68.m_size = (qsizetype)&local_60;
        QString::fromLatin1(QVar68);
        QVar69.m_size = (size_t)pcVar18;
        QVar69.field_0.m_data_utf8 = (char *)writer;
        QVar93.m_size = (size_t)local_60.d.ptr;
        QVar93.field_0.m_data = (void *)(uVar11 | 0x8000000000000000);
        QXmlStreamWriter::writeEmptyElement(QVar69,QVar93);
        if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
          }
        }
        pcVar18 = (this->styleNS).d.ptr;
        uVar11 = (this->styleNS).d.size;
        QVar70.m_data = (storage_type *)0x8;
        QVar70.m_size = (qsizetype)&local_60;
        QString::fromLatin1(QVar70);
        pcVar4 = local_60.d.ptr;
        aVar17.m_data = (void *)(local_60.d.size | 0x8000000000000000);
        pixelToPoint(&local_78,((Tab *)(pQVar19 + -6))->position);
        QVar71.m_size = (size_t)pcVar18;
        QVar71.field_0.m_data_utf8 = (char *)writer;
        QVar94.m_size = (size_t)pcVar4;
        QVar94.field_0.m_data = (void *)(uVar11 | 0x8000000000000000);
        QVar110.m_size = sVar13;
        QVar110.field_0.m_data = aVar17.m_data;
        QXmlStreamWriter::writeAttribute(QVar71,QVar94,QVar110);
        if ((QTextFormatPrivate *)local_78.d.d != (QTextFormatPrivate *)0x0) {
          LOCK();
          *(int *)local_78.d.d = *(int *)local_78.d.d + -1;
          UNLOCK();
          if (*(int *)local_78.d.d == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
          }
        }
        switch(*(TabType *)(pQVar19 + -2)) {
        case LeftTab:
          psVar12 = (storage_type *)0x4;
          break;
        case RightTab:
          psVar12 = &DAT_00000005;
          break;
        case CenterTab:
          psVar12 = &DAT_00000006;
          break;
        case DelimiterTab:
          psVar12 = (storage_type *)0x4;
          break;
        default:
          local_1f0 = (QArrayData *)0x0;
          goto LAB_005c70ec;
        }
        QVar72.m_data = psVar12;
        QVar72.m_size = (qsizetype)&local_60;
        QString::fromLatin1(QVar72);
        local_1f0 = &(local_60.d.d)->super_QArrayData;
LAB_005c70ec:
        pcVar18 = (this->styleNS).d.ptr;
        uVar11 = (this->styleNS).d.size;
        QVar73.m_data = (storage_type *)0x4;
        QVar73.m_size = (qsizetype)&local_60;
        QString::fromLatin1(QVar73);
        QVar111.field_0.m_data = (void *)(local_60.d.size | 0x8000000000000000);
        QVar74.m_size = (size_t)pcVar18;
        QVar74.field_0.m_data_utf8 = (char *)writer;
        QVar95.m_size = (size_t)local_60.d.ptr;
        QVar95.field_0.m_data = (void *)(uVar11 | 0x8000000000000000);
        QVar111.m_size = sVar13;
        QXmlStreamWriter::writeAttribute(QVar74,QVar95,QVar111);
        if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (pQVar19->ucs != L'\0') {
          pcVar18 = (this->styleNS).d.ptr;
          uVar11 = (this->styleNS).d.size;
          QVar75.m_data = (storage_type *)0x4;
          QVar75.m_size = (qsizetype)&local_60;
          QString::fromLatin1(QVar75);
          QVar112.field_0.m_data = (void *)(local_60.d.size | 0x8000000000000000);
          QVar76.m_size = (size_t)pcVar18;
          QVar76.field_0.m_data_utf8 = (char *)writer;
          QVar96.m_size = (size_t)local_60.d.ptr;
          QVar96.field_0.m_data = (void *)(uVar11 | 0x8000000000000000);
          QVar112.m_size = sVar13;
          QXmlStreamWriter::writeAttribute(QVar76,QVar96,QVar112);
          if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        if (local_1f0 != (QArrayData *)0x0) {
          LOCK();
          (local_1f0->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_1f0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_1f0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_1f0,2,0x10);
          }
        }
        iVar8 = QList<QTextOption::Tab>::end((QList<QTextOption::Tab> *)&local_b8);
        pTVar20 = (Tab *)(pQVar19 + 2);
        pQVar19 = pQVar19 + 8;
      } while (pTVar20 != iVar8.i);
    }
    QXmlStreamWriter::writeEndElement();
    piVar1 = (int *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate
                  ((QArrayData *)CONCAT44(local_b8.a.d.d._4_4_,local_b8.a.d.d._0_4_),0x10,0x10);
      }
    }
  }
  QXmlStreamWriter::writeEndElement();
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextOdfWriter::writeBlockFormat(QXmlStreamWriter &writer, QTextBlockFormat format, int formatIndex) const
{
    writer.writeStartElement(styleNS, QString::fromLatin1("style"));
    writer.writeAttribute(styleNS, QString::fromLatin1("name"), QString::fromLatin1("p%1").arg(formatIndex));
    writer.writeAttribute(styleNS, QString::fromLatin1("family"), QString::fromLatin1("paragraph"));
    writer.writeStartElement(styleNS, QString::fromLatin1("paragraph-properties"));

    if (format.hasProperty(QTextBlockFormat::LineHeightType)) {
        const int blockLineHeightType = format.lineHeightType();
        const qreal blockLineHeight = format.lineHeight();
        QString type, value;
        switch (blockLineHeightType) {
        case QTextBlockFormat::SingleHeight:
            type = QString::fromLatin1("line-height");
            value = QString::fromLatin1("100%");
            break;
        case QTextBlockFormat::ProportionalHeight:
            type = QString::fromLatin1("line-height");
            value = QString::number(blockLineHeight) + QString::fromLatin1("%");
            break;
        case QTextBlockFormat::FixedHeight:
            type = QString::fromLatin1("line-height");
            value = pixelToPoint(qMax(qreal(0.), blockLineHeight));
            break;
        case QTextBlockFormat::MinimumHeight:
            type = QString::fromLatin1("line-height-at-least");
            value = pixelToPoint(qMax(qreal(0.), blockLineHeight));
            break;
        case QTextBlockFormat::LineDistanceHeight:
            type = QString::fromLatin1("line-spacing");
            value = pixelToPoint(qMax(qreal(0.), blockLineHeight));
        }

        if (!type.isNull())
            writer.writeAttribute(styleNS, type, value);
    }

    if (format.hasProperty(QTextFormat::BlockAlignment)) {
        const Qt::Alignment alignment = format.alignment() & Qt::AlignHorizontal_Mask;
        QString value;
        if (alignment == Qt::AlignLeading)
            value = QString::fromLatin1("start");
        else if (alignment == Qt::AlignTrailing)
            value = QString::fromLatin1("end");
        else if (alignment == (Qt::AlignLeft | Qt::AlignAbsolute))
            value = QString::fromLatin1("left");
        else if (alignment == (Qt::AlignRight | Qt::AlignAbsolute))
            value = QString::fromLatin1("right");
        else if (alignment == Qt::AlignHCenter)
            value = QString::fromLatin1("center");
        else if (alignment == Qt::AlignJustify)
            value = QString::fromLatin1("justify");
        else
            qWarning() << "QTextOdfWriter: unsupported paragraph alignment; " << format.alignment();
        if (! value.isNull())
            writer.writeAttribute(foNS, QString::fromLatin1("text-align"), value);
    }

    if (format.hasProperty(QTextFormat::BlockTopMargin))
        writer.writeAttribute(foNS, QString::fromLatin1("margin-top"), pixelToPoint(qMax(qreal(0.), format.topMargin())) );
    if (format.hasProperty(QTextFormat::BlockBottomMargin))
        writer.writeAttribute(foNS, QString::fromLatin1("margin-bottom"), pixelToPoint(qMax(qreal(0.), format.bottomMargin())) );
    if (format.hasProperty(QTextFormat::BlockLeftMargin) || format.hasProperty(QTextFormat::BlockIndent))
        writer.writeAttribute(foNS, QString::fromLatin1("margin-left"), pixelToPoint(qMax(qreal(0.),
            format.leftMargin() + format.indent())));
    if (format.hasProperty(QTextFormat::BlockRightMargin))
        writer.writeAttribute(foNS, QString::fromLatin1("margin-right"), pixelToPoint(qMax(qreal(0.), format.rightMargin())) );
    if (format.hasProperty(QTextFormat::TextIndent))
        writer.writeAttribute(foNS, QString::fromLatin1("text-indent"), pixelToPoint(format.textIndent()));
    if (format.hasProperty(QTextFormat::PageBreakPolicy)) {
        if (format.pageBreakPolicy() & QTextFormat::PageBreak_AlwaysBefore)
            writer.writeAttribute(foNS, QString::fromLatin1("break-before"), QString::fromLatin1("page"));
        if (format.pageBreakPolicy() & QTextFormat::PageBreak_AlwaysAfter)
            writer.writeAttribute(foNS, QString::fromLatin1("break-after"), QString::fromLatin1("page"));
    }
    if (format.hasProperty(QTextFormat::BackgroundBrush)) {
        QBrush brush = format.background();
        writer.writeAttribute(foNS, QString::fromLatin1("background-color"), brush.color().name());
    }
    if (format.hasProperty(QTextFormat::BlockNonBreakableLines))
        writer.writeAttribute(foNS, QString::fromLatin1("keep-together"),
                format.nonBreakableLines() ? QString::fromLatin1("true") : QString::fromLatin1("false"));
    if (format.hasProperty(QTextFormat::TabPositions)) {
        QList<QTextOption::Tab> tabs = format.tabPositions();
        writer.writeStartElement(styleNS, QString::fromLatin1("tab-stops"));
        QList<QTextOption::Tab>::Iterator iterator = tabs.begin();
        while(iterator != tabs.end()) {
            writer.writeEmptyElement(styleNS, QString::fromLatin1("tab-stop"));
            writer.writeAttribute(styleNS, QString::fromLatin1("position"), pixelToPoint(iterator->position) );
            QString type;
            switch(iterator->type) {
            case QTextOption::DelimiterTab: type = QString::fromLatin1("char"); break;
            case QTextOption::LeftTab: type = QString::fromLatin1("left"); break;
            case QTextOption::RightTab: type = QString::fromLatin1("right"); break;
            case QTextOption::CenterTab: type = QString::fromLatin1("center"); break;
            }
            writer.writeAttribute(styleNS, QString::fromLatin1("type"), type);
            if (!iterator->delimiter.isNull())
                writer.writeAttribute(styleNS, QString::fromLatin1("char"), iterator->delimiter);
            ++iterator;
        }

        writer.writeEndElement(); // tab-stops
    }

    writer.writeEndElement(); // paragraph-properties
    writer.writeEndElement(); // style
}